

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodySharedMass::Compute_invMb_v
          (ChVariablesBodySharedMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  uint __line;
  int iVar10;
  Scalar *pSVar11;
  char *__assertion;
  CoeffReturnType CVar12;
  CoeffReturnType CVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  lVar9 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  iVar10 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar9 == iVar10) {
    lVar9 = *(long *)&(result->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ).field_0x8;
    iVar10 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
    if (lVar9 == iVar10) {
      dVar1 = this->sharedmass->inv_mass;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,0);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,0);
      *pSVar11 = CVar12 * dVar1;
      dVar1 = this->sharedmass->inv_mass;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,1);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,1);
      *pSVar11 = CVar12 * dVar1;
      dVar1 = this->sharedmass->inv_mass;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,2);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,2);
      *pSVar11 = CVar12 * dVar1;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
      ;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      CVar13 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = CVar12;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = CVar13 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar14,auVar20,auVar3);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
      ;
      auVar17._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar17._8_56_ = extraout_var;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar1;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar17._0_16_,auVar25,auVar4);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,3);
      *pSVar11 = auVar3._0_8_;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
      ;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
      ;
      CVar13 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = CVar12;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = CVar13 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar15,auVar21,auVar5);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
      ;
      auVar18._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar18._8_56_ = extraout_var_00;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar1;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar18._0_16_,auVar22,auVar6);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,4);
      *pSVar11 = auVar3._0_8_;
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
      ;
      CVar12 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,3);
      dVar2 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
      ;
      CVar13 = Eigen::
               DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             *)vect,4);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = CVar12;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = CVar13 * dVar2;
      auVar3 = vfmadd231sd_fma(auVar16,auVar23,auVar7);
      dVar1 = (this->sharedmass->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
      ;
      auVar19._0_8_ =
           Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,5);
      auVar19._8_56_ = extraout_var_01;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd213sd_fma(auVar19._0_16_,auVar24,auVar8);
      pSVar11 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                              *)result,5);
      *pSVar11 = auVar3._0_8_;
      return;
    }
    __assertion = "result.size() == Get_ndof()";
    __line = 0x4c;
  }
  else {
    __assertion = "vect.size() == Get_ndof()";
    __line = 0x4b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                ,__line,
                "virtual void chrono::ChVariablesBodySharedMass::Compute_invMb_v(ChVectorRef, ChVectorConstRef) const"
               );
}

Assistant:

void ChVariablesBodySharedMass::Compute_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) = sharedmass->inv_mass * vect(0);
    result(1) = sharedmass->inv_mass * vect(1);
    result(2) = sharedmass->inv_mass * vect(2);
    result(3) = sharedmass->inv_inertia(0, 0) * vect(3) + sharedmass->inv_inertia(0, 1) * vect(4) +
                sharedmass->inv_inertia(0, 2) * vect(5);
    result(4) = sharedmass->inv_inertia(1, 0) * vect(3) + sharedmass->inv_inertia(1, 1) * vect(4) +
                sharedmass->inv_inertia(1, 2) * vect(5);
    result(5) = sharedmass->inv_inertia(2, 0) * vect(3) + sharedmass->inv_inertia(2, 1) * vect(4) +
                sharedmass->inv_inertia(2, 2) * vect(5);
}